

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraClaus.c
# Opt level: O0

void Fra_ClausEstimateCoverageOne(Fra_Sml_t *pSim,int *pLits,int nLits,int *pVar2Id,uint *pResult)

{
  int iVar1;
  uint *puVar2;
  uint local_c8;
  int local_c4;
  int local_c0;
  int w;
  int i;
  int iVar;
  uint *pSims [16];
  uint *pResult_local;
  int *pVar2Id_local;
  int nLits_local;
  int *pLits_local;
  Fra_Sml_t *pSim_local;
  
  for (local_c0 = 0; local_c0 < nLits; local_c0 = local_c0 + 1) {
    iVar1 = lit_var(pLits[local_c0]);
    puVar2 = Fra_ObjSim(pSim,pVar2Id[iVar1]);
    *(uint **)(&i + (long)local_c0 * 2) = puVar2;
  }
  for (local_c4 = 0; local_c4 < pSim->nWordsTotal; local_c4 = local_c4 + 1) {
    pResult[local_c4] = 0xffffffff;
    for (local_c0 = 0; local_c0 < nLits; local_c0 = local_c0 + 1) {
      iVar1 = lit_sign(pLits[local_c0]);
      if (iVar1 == 0) {
        local_c8 = *(uint *)(*(long *)(&i + (long)local_c0 * 2) + (long)local_c4 * 4) ^ 0xffffffff;
      }
      else {
        local_c8 = *(uint *)(*(long *)(&i + (long)local_c0 * 2) + (long)local_c4 * 4);
      }
      pResult[local_c4] = local_c8 & pResult[local_c4];
    }
  }
  return;
}

Assistant:

void Fra_ClausEstimateCoverageOne( Fra_Sml_t * pSim, int * pLits, int nLits, int * pVar2Id, unsigned * pResult )
{
    unsigned * pSims[16];
    int iVar, i, w;
    for ( i = 0; i < nLits; i++ )
    {
        iVar = lit_var(pLits[i]);
        pSims[i] = Fra_ObjSim( pSim, pVar2Id[iVar] );
    }
    for ( w = 0; w < pSim->nWordsTotal; w++ )
    {
        pResult[w] = ~(unsigned)0;
        for ( i = 0; i < nLits; i++ )
            pResult[w] &= (lit_sign(pLits[i])? pSims[i][w] : ~pSims[i][w]);
    }
}